

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O3

size_t exr_compress_max_buffer_size(size_t in_bytes)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = libdeflate_zlib_compress_bound(0,in_bytes);
  if ((uVar1 < 0xfffffffffffffff7) && (in_bytes <= in_bytes * 0x82)) {
    sVar2 = in_bytes * 0x82 >> 7;
    if (sVar2 <= uVar1 + 9) {
      sVar2 = uVar1 + 9;
    }
  }
  else {
    sVar2 = 0xffffffffffffffff;
  }
  return sVar2;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

size_t exr_compress_max_buffer_size (size_t in_bytes)
{
    size_t r, extra;

    r = libdeflate_zlib_compress_bound (NULL, in_bytes);
    /*
     * lib deflate has a message about needing a 9 byte boundary
     * but is unclear if it actually adds that or not
     * (see the comment on libdeflate_deflate_compress)
     */
    if (r > (SIZE_MAX - 9))
        return (size_t)(SIZE_MAX);
    r += 9;

    /*
     * old library had uiAdd( uiAdd( in, ceil(in * 0.01) ), 100 )
     */
    extra = (in_bytes * (size_t)130);
    if (extra < in_bytes)
        return (size_t)(SIZE_MAX);
    extra /= (size_t)128;

    if (extra > (SIZE_MAX - 100))
        return (size_t)(SIZE_MAX);

    if (extra > r)
        r = extra;
    return r;
}